

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Cash.cpp
# Opt level: O2

void __thiscall Cash::display(Cash *this)

{
  long lVar1;
  ostream *poVar2;
  
  Transaction::display(&this->super_Transaction);
  lVar1 = std::cout;
  *(uint *)(std::ios_base::Init::Init + *(long *)(std::cout + -0x18)) =
       *(uint *)(std::ios_base::Init::Init + *(long *)(std::cout + -0x18)) & 0xfffffefb | 4;
  *(undefined8 *)(&__cxxabiv1::__si_class_type_info::vtable + *(long *)(lVar1 + -0x18)) = 2;
  poVar2 = std::operator<<((ostream *)&std::cout,"\tPayment Method: Cash");
  poVar2 = std::endl<char,std::char_traits<char>>(poVar2);
  std::operator<<(poVar2,"\tAmount Paid: $");
  poVar2 = std::ostream::_M_insert<double>(this->totalPaid);
  poVar2 = std::endl<char,std::char_traits<char>>(poVar2);
  std::operator<<(poVar2,"\tChange due: $");
  poVar2 = std::ostream::_M_insert<double>(this->changeDue);
  std::endl<char,std::char_traits<char>>(poVar2);
  return;
}

Assistant:

void Cash::display() const
{
    Transaction::display();

    cout << fixed << setprecision(2) << "\tPayment Method: Cash" << endl << "\tAmount Paid: $" << totalPaid << endl << "\tChange due: $" << changeDue << endl;
}